

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::NegativeInterCellsVerticalLinesProduceNegativeCover
          (VectorRasterizerTests *this)

{
  cell reference3 [3];
  cell reference2 [2];
  cell reference1 [6];
  vector_rasterizer vr;
  allocator local_151;
  string local_150;
  LocationInfo local_130;
  undefined1 local_108 [8];
  undefined1 auStack_100 [8];
  undefined1 auStack_f8 [16];
  char *local_e8;
  undefined1 auStack_e0 [24];
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [8];
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [16];
  undefined1 auStack_a0 [8];
  undefined1 auStack_98 [24];
  vector_rasterizer local_80;
  
  vector_rasterizer::vector_rasterizer(&local_80);
  vector_rasterizer::line(&local_80,0x300,0xa1a,0x300,0x500);
  auStack_98._0_2_ = -0x100;
  auStack_98._2_2_ = 3;
  auStack_98._4_2_ = 5;
  auStack_98._6_4_ = 0;
  auStack_98._10_2_ = -0x100;
  auStack_b0._8_2_ = 7;
  auStack_b0._10_4_ = 0;
  auStack_b0._14_2_ = -0x100;
  auStack_a0._0_2_ = 3;
  auStack_a0._2_2_ = 6;
  auStack_a0._4_4_ = 0;
  local_b8 = (undefined1  [8])0x80003ff000000;
  auStack_b0._0_4_ = 0;
  auStack_b0._4_2_ = -0x100;
  auStack_b0._6_2_ = 3;
  local_c8._0_2_ = 3;
  local_c8._2_2_ = 10;
  local_c8._4_4_ = 0;
  auStack_c0 = (undefined1  [8])0x90003ffe6;
  std::__cxx11::string::string
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)local_108);
  ut::LocationInfo::LocationInfo(&local_130,&local_150,0x14c);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,6ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [6])local_c8,&local_80._cells,&local_130);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::reset(&local_80);
  vector_rasterizer::line(&local_80,0x1700,0x1300,0x1700,0x1100);
  local_e8 = "stsEEEjE5resetEv";
  auStack_e0._0_8_ = 0x110017ff00;
  auStack_e0._8_4_ = 0xff000000;
  std::__cxx11::string::string
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)local_108);
  ut::LocationInfo::LocationInfo(&local_130,&local_150,0x15a);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [2])&local_e8,&local_80._cells,&local_130);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::reset(&local_80);
  vector_rasterizer::line(&local_80,-0x753100,-0x2cd,-0x753100,-0x4b6);
  auStack_f8._0_6_ = 0x8acfff000000;
  auStack_f8._6_2_ = -5;
  auStack_f8._8_4_ = 0;
  auStack_f8._12_2_ = -0xb6;
  local_108._0_2_ = -0x7531;
  local_108._2_2_ = -3;
  local_108._4_4_ = 0;
  auStack_100._0_2_ = -0x33;
  auStack_100._2_2_ = -0x7531;
  auStack_100._4_2_ = -4;
  auStack_100._6_2_ = 0;
  std::__cxx11::string::string
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_151);
  ut::LocationInfo::LocationInfo(&local_130,&local_150,0x169);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,3ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [3])local_108,&local_80._cells,&local_130);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&local_80);
  return;
}

Assistant:

test( NegativeInterCellsVerticalLinesProduceNegativeCover )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(fp(3.0), fp(10.1), fp(3.0), fp(5.0));

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 3, 10, 0, -26 },
					{ 3, 9, 0, -256 },
					{ 3, 8, 0, -256 },
					{ 3, 7, 0, -256 },
					{ 3, 6, 0, -256 },
					{ 3, 5, 0, -256 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(23.0), fp(19.0), fp(23.0), fp(17.0));

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 23, 18, 0, -256 },
					{ 23, 17, 0, -256 },
				};

				assert_equal(reference2, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(-30001.0), fp(-2.8), fp(-30001.0), fp(-4.71));

				// ASSERT
				const vector_rasterizer::cell reference3[] = {
					{ -30001, -3, 0, -51 },
					{ -30001, -4, 0, -256 },
					{ -30001, -5, 0, -182 },
				};

				assert_equal(reference3, vr.cells());
			}